

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valfmt_get.c
# Opt level: O0

int mpt_valfmt_get(mpt_value_format *ptr,char *src)

{
  int iVar1;
  ushort **ppuVar2;
  long lVar3;
  int *piVar4;
  char *__nptr;
  long val;
  char *next;
  char *pos;
  char *pcStack_20;
  mpt_value_format fmt;
  char *src_local;
  mpt_value_format *ptr_local;
  
  pcStack_20 = src;
  memset((void *)((long)&pos + 4),0,4);
  next = pcStack_20;
  if (pcStack_20 == (char *)0x0) {
    *ptr = pos._4_4_;
    ptr_local._4_4_ = 0;
  }
  else {
    while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*next] & 0x2000) != 0) {
      next = next + 1;
    }
    if (*next == '\0') {
      *ptr = pos._4_4_;
      ptr_local._4_4_ = (int)next - (int)pcStack_20;
    }
    else {
      if (*next == '+') {
        pos._4_4_ = (mpt_value_format)((uint)pos._4_4_ | 0x100);
        next = next + 1;
      }
      iVar1 = tolower((int)*next);
      switch(iVar1) {
      case 0x61:
        pos._4_4_ = (mpt_value_format)((uint)pos._4_4_ | 0x20);
      case 0x78:
        pos._4_4_ = (mpt_value_format)((uint)pos._4_4_ | 0x11);
        next = next + 1;
        break;
      default:
        ppuVar2 = __ctype_b_loc();
        if (((*ppuVar2)[(int)*next] & 0x800) == 0) {
          return -1;
        }
        break;
      case 0x66:
        pos._4_4_ = (mpt_value_format)CONCAT13('\x06',pos._4_3_);
      case 0x67:
        next = next + 1;
        break;
      case 0x6f:
        pos._4_4_ = (mpt_value_format)((uint)pos._4_4_ | 2);
      case 0x65:
        pos._4_4_ = (mpt_value_format)((uint)pos._4_4_ | 0x20);
        next = next + 1;
      }
      lVar3 = strtol(next,(char **)&val,0);
      if ((char *)val == next) {
        ptr_local._4_4_ = -1;
      }
      else {
        next = (char *)val;
        if ((lVar3 < 0) || (0xff < lVar3)) {
          ptr_local._4_4_ = -2;
        }
        else {
          pos._4_3_ = CONCAT12((char)lVar3,pos._4_2_);
          if ((*(char *)val == '\0') ||
             (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*next] & 0x2000) != 0)) {
            *ptr = pos._4_4_;
            ptr_local._4_4_ = (int)next - (int)pcStack_20;
          }
          else {
            __nptr = next + 1;
            if (*next == '.') {
              next = __nptr;
              lVar3 = strtol(__nptr,(char **)&val,0);
              if ((char *)val == next) {
                ptr_local._4_4_ = -1;
              }
              else if ((lVar3 < 0) || (0x7e < lVar3)) {
                ptr_local._4_4_ = -2;
              }
              else {
                pos._4_4_ = (mpt_value_format)CONCAT13((uint8_t)lVar3,pos._4_3_);
                *ptr = pos._4_4_;
                ptr_local._4_4_ = (int)val - (int)pcStack_20;
              }
            }
            else {
              next = __nptr;
              piVar4 = __errno_location();
              *piVar4 = 0x16;
              ptr_local._4_4_ = -3;
            }
          }
        }
      }
    }
  }
  return ptr_local._4_4_;
}

Assistant:

extern int mpt_valfmt_get(MPT_STRUCT(value_format) *ptr, const char *src)
{
	MPT_STRUCT(value_format) fmt = MPT_VALFMT_INIT;
	const char *pos;
	char *next;
	long val;
	
	if (!(pos = src)) {
		*ptr = fmt;
		return 0;
	}
	while (isspace(*pos)) {
		pos++;
	}
	/* select format */
	if (!*pos) {
		*ptr = fmt;
		return pos - src;
	}
	if (*pos == '+') {
		fmt.flags |= MPT_VALFMT(Sign);
		++pos;
	}
	
	switch (tolower(*pos)) {
	  case 'f': fmt.dec = 6; /* fall through */
	  case 'g': ++pos; break;
	  case 'a': fmt.flags |= MPT_VALFMT(Scientific); /* fall through */
	  case 'x': fmt.flags |= MPT_VALFMT(NumberHex); ++pos; break;
	  case 'o': fmt.flags |= MPT_VALFMT(IntOctal); /* fall through */
	  case 'e': fmt.flags |= MPT_VALFMT(Scientific); ++pos; break;
	  default:
		if (!isdigit(*pos)) {
			return MPT_ERROR(BadArgument);
		}
	}
	/* get field with */
	val = strtol(pos, &next, 0);
	
	if (next == pos) {
		return MPT_ERROR(BadArgument);
	}
	pos = next;
	if (val < 0 || val > UINT8_MAX) {
		return MPT_ERROR(BadValue);
	}
	fmt.width = val;
	if (!*pos || isspace(*pos)) {
		*ptr = fmt;
		return pos - src;
	}
	if (*(pos++) != '.') {
		errno = EINVAL;
		return -3;
	}
	/* get digits after decimal point */
	val = strtol(pos, &next, 0);
	
	if (next == pos) {
		return MPT_ERROR(BadArgument);
	}
	pos = next;
	if (val < 0 || val >= INT8_MAX) {
		return MPT_ERROR(BadValue);
	}
	fmt.dec = val;
	
	*ptr = fmt;
	
	return pos - src;
}